

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::memorystatistics(tetgenmesh *this)

{
  memorypool *pmVar1;
  tetgenbehavior *ptVar2;
  memorypool *pmVar3;
  ulong uVar4;
  char *pcVar5;
  unsigned_long n;
  unsigned_long n_00;
  unsigned_long n_01;
  unsigned_long uVar6;
  
  puts("Memory usage statistics:\n");
  pmVar1 = this->tetrahedrons;
  uVar4 = 0xffffffffffffffff;
  pmVar3 = pmVar1;
  do {
    pmVar3 = (memorypool *)pmVar3->firstblock;
    pmVar1->pathblock = (void **)pmVar3;
    uVar4 = (ulong)((int)uVar4 + 1);
  } while (pmVar3 != (memorypool *)0x0);
  ptVar2 = this->b;
  n_01 = (long)pmVar1->itembytes * pmVar1->maxitems +
         (long)this->points->itembytes * this->points->maxitems;
  if ((ptVar2->plc == 0) && (ptVar2->refine == 0)) {
    uVar6 = 0;
  }
  else {
    n_01 = n_01 + (long)this->subsegs->itembytes * this->subsegs->maxitems +
                  (long)this->subfaces->itembytes * this->subfaces->maxitems;
    uVar6 = (long)this->tet2segpool->itembytes * this->tet2segpool->maxitems +
            (long)this->tet2subpool->itembytes * this->tet2subpool->maxitems;
  }
  n = (long)this->flippool->itembytes * this->flippool->maxitems +
      this->cavebdrylist->totalmemory + this->cavetetlist->totalmemory +
      this->caveoldtetlist->totalmemory;
  if ((ptVar2->plc != 0) || (ptVar2->refine != 0)) {
    n = n + this->subsegstack->totalmemory + this->subfacstack->totalmemory +
        this->subvertstack->totalmemory + this->caveshlist->totalmemory +
        this->caveshbdlist->totalmemory + this->cavesegshlist->totalmemory +
        this->cavetetshlist->totalmemory + this->cavetetseglist->totalmemory +
        this->caveencshlist->totalmemory + this->caveencseglist->totalmemory +
        this->cavetetvertlist->totalmemory + this->unflipqueue->totalmemory;
  }
  printf("  Maximum number of tetrahedra:  %ld\n",pmVar1->maxitems);
  printf("  Maximum number of tet blocks (blocksize = %d):  %d\n",
         (ulong)(uint)this->b->tetrahedraperblock,uVar4);
  if ((this->b->plc == 0) && (this->b->refine == 0)) {
    pcVar5 = "  Approximate memory for tetrahedralization (bytes):  ";
    n_00 = n_01;
  }
  else {
    pcVar5 = "  Approximate memory for tetrahedral mesh (bytes):  ";
    printf("  Approximate memory for tetrahedral mesh (bytes):  ");
    printfcomma((tetgenmesh *)pcVar5,n_01);
    putchar(10);
    pcVar5 = "  Approximate memory for extra pointers (bytes):  ";
    n_00 = uVar6;
  }
  printf(pcVar5);
  printfcomma((tetgenmesh *)pcVar5,n_00);
  putchar(10);
  pcVar5 = "  Approximate memory for algorithms (bytes):  ";
  printf("  Approximate memory for algorithms (bytes):  ");
  printfcomma((tetgenmesh *)pcVar5,n);
  putchar(10);
  pcVar5 = "  Approximate memory for working arrays (bytes):  ";
  printf("  Approximate memory for working arrays (bytes):  ");
  printfcomma((tetgenmesh *)pcVar5,this->totalworkmemory);
  putchar(10);
  pcVar5 = "  Approximate total used memory (bytes):  ";
  printf("  Approximate total used memory (bytes):  ");
  printfcomma((tetgenmesh *)pcVar5,uVar6 + n_01 + n + this->totalworkmemory);
  putchar(10);
  putchar(10);
  return;
}

Assistant:

void tetgenmesh::memorystatistics()
{
  printf("Memory usage statistics:\n\n");
 
  // Count the number of blocks of tetrahedra. 
  int tetblocks = 0;
  tetrahedrons->pathblock = tetrahedrons->firstblock;
  while (tetrahedrons->pathblock != NULL) {
    tetblocks++;
    tetrahedrons->pathblock = (void **) *(tetrahedrons->pathblock);  
  }

  // Calculate the total memory (in bytes) used by storing meshes.
  unsigned long totalmeshmemory = 0l, totalt2shmemory = 0l;
  totalmeshmemory = points->maxitems * points->itembytes +
                    tetrahedrons->maxitems * tetrahedrons->itembytes;
  if (b->plc || b->refine) {
    totalmeshmemory += (subfaces->maxitems * subfaces->itembytes +
                        subsegs->maxitems * subsegs->itembytes);
    totalt2shmemory = (tet2subpool->maxitems * tet2subpool->itembytes +
                       tet2segpool->maxitems * tet2segpool->itembytes);
  }

  unsigned long totalalgomemory = 0l;
  totalalgomemory = cavetetlist->totalmemory + cavebdrylist->totalmemory +
                    caveoldtetlist->totalmemory + 
                    flippool->maxitems * flippool->itembytes;
  if (b->plc || b->refine) {
    totalalgomemory += (subsegstack->totalmemory + subfacstack->totalmemory +
                        subvertstack->totalmemory + 
                        caveshlist->totalmemory + caveshbdlist->totalmemory +
                        cavesegshlist->totalmemory +
                        cavetetshlist->totalmemory + 
                        cavetetseglist->totalmemory +
                        caveencshlist->totalmemory +
                        caveencseglist->totalmemory +
                        cavetetvertlist->totalmemory +
                        unflipqueue->totalmemory);
  }

  printf("  Maximum number of tetrahedra:  %ld\n", tetrahedrons->maxitems);
  printf("  Maximum number of tet blocks (blocksize = %d):  %d\n",
         b->tetrahedraperblock, tetblocks);
  /*
  if (b->plc || b->refine) {
    printf("  Approximate memory for tetrahedral mesh (bytes):  %ld\n",
           totalmeshmemory);
    
    printf("  Approximate memory for extra pointers (bytes):  %ld\n",
           totalt2shmemory);
  } else {
    printf("  Approximate memory for tetrahedralization (bytes):  %ld\n",
           totalmeshmemory);
  }
  printf("  Approximate memory for algorithms (bytes):  %ld\n",
         totalalgomemory);
  printf("  Approximate memory for working arrays (bytes):  %ld\n",
         totalworkmemory);
  printf("  Approximate total used memory (bytes):  %ld\n",
         totalmeshmemory + totalt2shmemory + totalalgomemory + 
         totalworkmemory);
  */
  if (b->plc || b->refine) {
    printf("  Approximate memory for tetrahedral mesh (bytes):  ");
    printfcomma(totalmeshmemory); printf("\n");
    
    printf("  Approximate memory for extra pointers (bytes):  ");
    printfcomma(totalt2shmemory); printf("\n");
  } else {
    printf("  Approximate memory for tetrahedralization (bytes):  ");
    printfcomma(totalmeshmemory); printf("\n");
  }
  printf("  Approximate memory for algorithms (bytes):  ");
  printfcomma(totalalgomemory); printf("\n");
  printf("  Approximate memory for working arrays (bytes):  ");
  printfcomma(totalworkmemory); printf("\n");
  printf("  Approximate total used memory (bytes):  ");
  printfcomma(totalmeshmemory + totalt2shmemory + totalalgomemory + 
              totalworkmemory);
  printf("\n");

  printf("\n");
}